

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

int __thiscall IlmThread_3_2::ThreadPool::numThreads(ThreadPool *this)

{
  bool bVar1;
  element_type *peVar2;
  ProviderPtr sp;
  Data *in_stack_ffffffffffffffc8;
  int local_2c;
  __shared_ptr local_18 [24];
  
  Data::getProvider(in_stack_ffffffffffffffc8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x107ce6);
    local_2c = (*peVar2->_vptr_ThreadPoolProvider[2])();
  }
  else {
    local_2c = 0;
  }
  std::shared_ptr<IlmThread_3_2::ThreadPoolProvider>::~shared_ptr
            ((shared_ptr<IlmThread_3_2::ThreadPoolProvider> *)0x107d1c);
  return local_2c;
}

Assistant:

int
ThreadPool::numThreads () const
{
#ifdef ENABLE_THREADING
    Data::ProviderPtr sp = _data->getProvider ();
    return (sp) ? sp->numThreads () : 0;
#else
    return 0;
#endif
}